

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O2

void get_rate_distortion(int *rate_cost,int64_t *recon_error,int64_t *pred_error,int16_t *src_diff,
                        tran_low_t *coeff,tran_low_t *qcoeff,tran_low_t *dqcoeff,AV1_COMMON *cm,
                        MACROBLOCK *x,YV12_BUFFER_CONFIG **ref_frame_ptr,uint8_t **rec_buffer_pool,
                        int *rec_stride_pool,TX_SIZE tx_size,PREDICTION_MODE best_mode,int mi_row,
                        int mi_col,int use_y_only_rate_distortion,int do_recon,
                        TplTxfmStats *tpl_txfm_stats)

{
  BLOCK_SIZE BVar1;
  int iVar2;
  SequenceHeader *pSVar3;
  YV12_BUFFER_CONFIG *pYVar4;
  uint uVar5;
  TX_SIZE tx_size_00;
  sbyte sVar6;
  byte bVar7;
  byte bVar8;
  InterpFilterParams *pIVar9;
  ulong uVar10;
  InterpFilterParams *pIVar11;
  ulong uVar12;
  BitDepthInfo bd_info;
  long lVar13;
  int iVar14;
  long lVar15;
  int ref;
  long lVar16;
  SCAN_ORDER *sc;
  int iVar17;
  long lVar18;
  undefined8 unaff_R15;
  int_mv best_mv;
  int local_220;
  int local_21c;
  tran_low_t *local_218;
  ulong local_210;
  uint8_t *local_208;
  ulong local_200;
  tran_low_t *local_1f8;
  int local_1ec;
  MACROBLOCKD *local_1e8;
  macroblockd_plane *local_1e0;
  long local_1d8;
  ulong local_1d0;
  int64_t sse;
  uint8_t *puStack_1c0;
  uint8_t *local_1b8;
  int src_stride_pool [3];
  InterPredParams local_120;
  uint8_t *local_48 [3];
  
  pSVar3 = cm->seq_params;
  *rate_cost = 0;
  *recon_error = 1;
  *pred_error = 1;
  pYVar4 = (x->e_mbd).cur_buf;
  local_48[0] = (pYVar4->field_5).field_0.y_buffer;
  local_48[1] = (pYVar4->field_5).field_0.u_buffer;
  local_48[2] = (pYVar4->field_5).field_0.v_buffer;
  src_stride_pool[0] = (pYVar4->field_4).field_0.y_stride;
  src_stride_pool[1] = (pYVar4->field_4).field_0.uv_stride;
  src_stride_pool[2] = src_stride_pool[1];
  BVar1 = txsize_to_bsize[tx_size];
  local_21c = mi_row << 2;
  local_220 = mi_col << 2;
  local_1e8 = &x->e_mbd;
  local_1ec = (int)CONCAT71((int7)((ulong)unaff_R15 >> 8),best_mode) + -0x19;
  local_1d0 = 0;
  local_218 = coeff;
  local_1f8 = qcoeff;
  while (local_1d0 != ((ulong)((uint)(use_y_only_rate_distortion == 0) * 2) | 1)) {
    local_1e0 = (x->e_mbd).plane + local_1d0;
    iVar17 = (x->e_mbd).plane[local_1d0].subsampling_x;
    iVar2 = (x->e_mbd).plane[local_1d0].subsampling_y;
    local_1d8 = (long)rec_stride_pool[local_1d0];
    local_208 = rec_buffer_pool[local_1d0] +
                ((local_220 >> ((byte)iVar17 & 0x1f)) +
                (rec_stride_pool[local_1d0] * local_21c >> ((byte)iVar2 & 0x1f)));
    local_200 = (ulong)av1_ss_size_lookup[BVar1][iVar17][iVar2];
    pIVar9 = av1_interp_4tap;
    pIVar11 = av1_interp_4tap;
    if ((0x10003UL >> (local_200 & 0x3f) & 1) == 0) {
      pIVar11 = av1_interp_filter_params_list;
    }
    if ((0x20005UL >> (local_200 & 0x3f) & 1) == 0) {
      pIVar9 = av1_interp_filter_params_list;
    }
    lVar15 = (ulong)(local_1d0 != 0) * 4;
    uVar12 = local_1d0;
    lVar13 = local_1d8;
    for (lVar16 = 0; uVar10 = local_1d0, lVar18 = local_1d8,
        (ulong)(best_mode == '\x18') + 1 != lVar16; lVar16 = lVar16 + 1) {
      if ((byte)local_1ec < 0xf4) {
        av1_predict_intra_block
                  (local_1e8,pSVar3->sb_size,(uint)pSVar3->enable_intra_edge_filter,
                   (uint)block_size_wide[local_200],(uint)block_size_high[local_200],""[local_200],
                   best_mode,0,0,'\x05',local_208,(int)lVar13,local_208,(int)lVar13,0,0,(int)uVar12)
        ;
        uVar10 = uVar12;
        lVar18 = lVar13;
      }
      else {
        best_mv = (*(x->e_mbd).mi)->mv[lVar16];
        pYVar4 = ref_frame_ptr[lVar16];
        sse = (int64_t)(pYVar4->field_5).field_0.y_buffer;
        puStack_1c0 = (pYVar4->field_5).field_0.u_buffer;
        local_1b8 = (pYVar4->field_5).field_0.v_buffer;
        local_120.ref_frame_buf.width = *(int *)((long)pYVar4->store_buf_adr + lVar15 + -0x48);
        local_210 = CONCAT44(local_210._4_4_,local_120.ref_frame_buf.width);
        local_120.ref_frame_buf.height = *(int *)((long)pYVar4->store_buf_adr + lVar15 + -0x40);
        bVar7 = (byte)local_1e0->subsampling_y;
        bVar8 = (byte)local_1e0->subsampling_x;
        local_120.ref_frame_buf.stride = *(int *)((long)pYVar4->store_buf_adr + lVar15 + -0x28);
        local_120.bit_depth = (x->e_mbd).bd;
        local_120.is_intrabc = 0;
        local_120.mode = TRANSLATION_PRED;
        local_120.comp_mode = UNIFORM_SINGLE;
        local_120.ref_frame_buf.buf = (uint8_t *)0x0;
        local_120.block_width = (uint)block_size_wide[local_200];
        local_120.block_height = (uint)block_size_high[local_200];
        local_120.pix_row = local_21c >> (bVar7 & 0x1f);
        local_120.pix_col = local_220 >> (bVar8 & 0x1f);
        local_120.subsampling_x = local_1e0->subsampling_x;
        local_120.subsampling_y = local_1e0->subsampling_y;
        local_120.use_hbd_buf = (uint)((x->e_mbd).cur_buf)->flags >> 3 & 1;
        local_120.top = (0x120U >> (bVar7 & 0x1f)) * -0x400 + 0x1000;
        local_120.left = (0x120U >> (bVar8 & 0x1f)) * -0x400 + 0x1000;
        local_120.interp_filter_params[0] = pIVar11;
        local_120.interp_filter_params[1] = pIVar9;
        local_120.scale_factors = (x->e_mbd).block_ref_scale_factors[0];
        local_120.ref_frame_buf.buf0 = (uint8_t *)(&sse)[local_1d0];
        iVar17 = 0xb;
        if (best_mode == '\x18') {
          local_120.mode = TRANSLATION_PRED;
          local_120.comp_mode = UNIFORM_COMP;
          iVar17 = 7;
        }
        local_120.conv_params.round_0 = local_120.bit_depth + -7;
        local_120.conv_params.round_1 = 0x15 - local_120.bit_depth;
        if (best_mode == '\x18') {
          local_120.conv_params.round_1 = 7;
        }
        local_120.conv_params.dst = (x->e_mbd).tmp_conv_dst;
        if (local_120.bit_depth < 0xb) {
          local_120.conv_params.round_0 = 3;
          local_120.conv_params.round_1 = iVar17;
        }
        local_120.conv_params.do_average = (int)lVar16;
        local_120.conv_params.dst_stride = 0x80;
        local_120.conv_params.plane = (int)local_1d0;
        local_120.conv_params.is_compound = (int)(best_mode == '\x18');
        local_120.conv_params.use_dist_wtd_comp_avg = 0;
        av1_enc_build_one_inter_predictor(local_208,(int)local_1d8,&best_mv.as_mv,&local_120);
      }
      uVar12 = uVar10;
      lVar13 = lVar18;
    }
    bVar7 = block_size_wide[local_200];
    local_210 = (ulong)""[local_200];
    bd_info = (BitDepthInfo)
              (CONCAT44((uint)((x->e_mbd).cur_buf)->flags >> 3,(x->e_mbd).bd) & 0x1ffffffff);
    av1_subtract_block(bd_info,(uint)block_size_high[local_200],(uint)bVar7,src_diff,(ulong)bVar7,
                       local_48[uVar12] +
                       ((local_220 >> ((byte)local_1e0->subsampling_x & 0x1f)) +
                       (src_stride_pool[uVar12] * local_21c >>
                       ((byte)local_1e0->subsampling_y & 0x1f))),(long)src_stride_pool[uVar12],
                       local_208,lVar13);
    uVar12 = local_210;
    iVar17 = (int)local_210;
    tx_size_00 = (TX_SIZE)local_210;
    av1_quick_txfm(0,tx_size_00,bd_info,src_diff,(uint)bVar7,local_218);
    sc = (SCAN_ORDER *)((long)&av1_scan_orders[0][0].scan + (ulong)(uint)(iVar17 << 8));
    bVar7 = "\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[txsize_to_bsize[uVar12]];
    av1_setup_quant(tx_size_00,0,0,0,(QUANT_PARAM *)&local_120);
    lVar13 = (long)(1 << (bVar7 & 0x1f));
    if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
      av1_quantize_fp_facade
                (local_218,lVar13,x->plane,local_1f8,dqcoeff,(uint16_t *)&best_mv.as_int,sc,
                 (QUANT_PARAM *)&local_120);
      lVar13 = (*av1_block_error)(local_218,dqcoeff,lVar13,&sse);
    }
    else {
      av1_highbd_quantize_fp_facade
                (local_218,lVar13,x->plane,local_1f8,dqcoeff,(uint16_t *)&best_mv.as_int,sc,
                 (QUANT_PARAM *)&local_120);
      lVar13 = (*av1_highbd_block_error)(local_218,dqcoeff,lVar13,&sse,(x->e_mbd).bd);
    }
    uVar12 = local_1d0;
    sVar6 = ((int)local_200 != 9) * '\x02';
    lVar13 = lVar13 >> sVar6;
    sse = sse >> sVar6;
    if (sse < 2) {
      sse = 1;
    }
    iVar17 = 1;
    for (uVar10 = 0; (ushort)best_mv.as_mv.row != uVar10; uVar10 = uVar10 + 1) {
      iVar2 = local_1f8[sc->scan[uVar10]];
      iVar14 = -iVar2;
      if (0 < iVar2) {
        iVar14 = iVar2;
      }
      uVar5 = 0x1f;
      if (iVar14 + 1U != 0) {
        for (; iVar14 + 1U >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      iVar17 = ((iVar17 - (uint)(iVar2 == 0)) - (uVar5 ^ 0x1f)) + 0x21;
    }
    if (lVar13 < 2) {
      lVar13 = 1;
    }
    if (do_recon != 0) {
      av1_inverse_transform_block
                (local_1e8,dqcoeff,0,'\0',(TX_SIZE)local_210,local_208,(int)local_1d8,
                 best_mv.as_int & 0xffff,0);
    }
    *recon_error = *recon_error + lVar13;
    *pred_error = *pred_error + sse;
    *rate_cost = *rate_cost + iVar17 * 0x200;
    local_1d0 = uVar12 + 1;
  }
  return;
}

Assistant:

static void get_rate_distortion(
    int *rate_cost, int64_t *recon_error, int64_t *pred_error,
    int16_t *src_diff, tran_low_t *coeff, tran_low_t *qcoeff,
    tran_low_t *dqcoeff, AV1_COMMON *cm, MACROBLOCK *x,
    const YV12_BUFFER_CONFIG *ref_frame_ptr[2], uint8_t *rec_buffer_pool[3],
    const int rec_stride_pool[3], TX_SIZE tx_size, PREDICTION_MODE best_mode,
    int mi_row, int mi_col, int use_y_only_rate_distortion, int do_recon,
    TplTxfmStats *tpl_txfm_stats) {
  const SequenceHeader *seq_params = cm->seq_params;
  *rate_cost = 0;
  *recon_error = 1;
  *pred_error = 1;

  (void)tpl_txfm_stats;

  MACROBLOCKD *xd = &x->e_mbd;
  int is_compound = (best_mode == NEW_NEWMV);
  int num_planes = use_y_only_rate_distortion ? 1 : MAX_MB_PLANE;

  uint8_t *src_buffer_pool[MAX_MB_PLANE] = {
    xd->cur_buf->y_buffer,
    xd->cur_buf->u_buffer,
    xd->cur_buf->v_buffer,
  };
  const int src_stride_pool[MAX_MB_PLANE] = {
    xd->cur_buf->y_stride,
    xd->cur_buf->uv_stride,
    xd->cur_buf->uv_stride,
  };

  const int_interpfilters kernel =
      av1_broadcast_interp_filter(EIGHTTAP_REGULAR);

  for (int plane = 0; plane < num_planes; ++plane) {
    struct macroblockd_plane *pd = &xd->plane[plane];
    BLOCK_SIZE bsize_plane =
        av1_ss_size_lookup[txsize_to_bsize[tx_size]][pd->subsampling_x]
                          [pd->subsampling_y];

    int dst_buffer_stride = rec_stride_pool[plane];
    int dst_mb_offset =
        ((mi_row * MI_SIZE * dst_buffer_stride) >> pd->subsampling_y) +
        ((mi_col * MI_SIZE) >> pd->subsampling_x);
    uint8_t *dst_buffer = rec_buffer_pool[plane] + dst_mb_offset;
    for (int ref = 0; ref < 1 + is_compound; ++ref) {
      if (!is_inter_mode(best_mode)) {
        av1_predict_intra_block(
            xd, seq_params->sb_size, seq_params->enable_intra_edge_filter,
            block_size_wide[bsize_plane], block_size_high[bsize_plane],
            max_txsize_rect_lookup[bsize_plane], best_mode, 0, 0,
            FILTER_INTRA_MODES, dst_buffer, dst_buffer_stride, dst_buffer,
            dst_buffer_stride, 0, 0, plane);
      } else {
        int_mv best_mv = xd->mi[0]->mv[ref];
        uint8_t *ref_buffer_pool[MAX_MB_PLANE] = {
          ref_frame_ptr[ref]->y_buffer,
          ref_frame_ptr[ref]->u_buffer,
          ref_frame_ptr[ref]->v_buffer,
        };
        InterPredParams inter_pred_params;
        struct buf_2d ref_buf = {
          NULL, ref_buffer_pool[plane],
          plane ? ref_frame_ptr[ref]->uv_width : ref_frame_ptr[ref]->y_width,
          plane ? ref_frame_ptr[ref]->uv_height : ref_frame_ptr[ref]->y_height,
          plane ? ref_frame_ptr[ref]->uv_stride : ref_frame_ptr[ref]->y_stride
        };
        av1_init_inter_params(&inter_pred_params, block_size_wide[bsize_plane],
                              block_size_high[bsize_plane],
                              (mi_row * MI_SIZE) >> pd->subsampling_y,
                              (mi_col * MI_SIZE) >> pd->subsampling_x,
                              pd->subsampling_x, pd->subsampling_y, xd->bd,
                              is_cur_buf_hbd(xd), 0,
                              xd->block_ref_scale_factors[0], &ref_buf, kernel);
        if (is_compound) av1_init_comp_mode(&inter_pred_params);
        inter_pred_params.conv_params = get_conv_params_no_round(
            ref, plane, xd->tmp_conv_dst, MAX_SB_SIZE, is_compound, xd->bd);

        av1_enc_build_one_inter_predictor(dst_buffer, dst_buffer_stride,
                                          &best_mv.as_mv, &inter_pred_params);
      }
    }

    int src_stride = src_stride_pool[plane];
    int src_mb_offset = ((mi_row * MI_SIZE * src_stride) >> pd->subsampling_y) +
                        ((mi_col * MI_SIZE) >> pd->subsampling_x);

    int this_rate = 1;
    int64_t this_recon_error = 1;
    int64_t sse;
    txfm_quant_rdcost(
        x, src_diff, block_size_wide[bsize_plane],
        src_buffer_pool[plane] + src_mb_offset, src_stride, dst_buffer,
        dst_buffer_stride, coeff, qcoeff, dqcoeff, block_size_wide[bsize_plane],
        block_size_high[bsize_plane], max_txsize_rect_lookup[bsize_plane],
        do_recon, &this_rate, &this_recon_error, &sse);

#if CONFIG_BITRATE_ACCURACY
    if (plane == 0 && tpl_txfm_stats) {
      // We only collect Y plane's transform coefficient
      av1_record_tpl_txfm_block(tpl_txfm_stats, coeff);
    }
#endif  // CONFIG_BITRATE_ACCURACY

    *recon_error += this_recon_error;
    *pred_error += sse;
    *rate_cost += this_rate;
  }
}